

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::emitCurve(SemanticParser *this,SP *shape)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  bool bVar17;
  int iVar18;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  float fVar20;
  SP SVar21;
  SP ours;
  string basis;
  string type;
  string local_e8;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  string local_b8;
  string local_98;
  undefined1 local_70 [32];
  SP local_50;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_40 = *(_Base_ptr *)(*in_RDX + 0x58);
  local_38 = *(_Base_ptr *)(*in_RDX + 0x60);
  if (local_38 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_70,(SP *)shape);
  std::__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::Curve>,std::shared_ptr<pbrt::Material>>
            ((__shared_ptr<pbrt::Curve,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
             (allocator<pbrt::Curve> *)&local_b8,(shared_ptr<pbrt::Material> *)local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (local_38 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  lVar3 = *in_RDX;
  uVar6 = *(undefined4 *)(lVar3 + 0x78);
  uVar7 = *(undefined4 *)(lVar3 + 0x7c);
  uVar8 = *(undefined4 *)(lVar3 + 0x80);
  uVar9 = *(undefined4 *)(lVar3 + 0x84);
  uVar10 = *(undefined4 *)(lVar3 + 0x88);
  uVar11 = *(undefined4 *)(lVar3 + 0x8c);
  uVar12 = *(undefined4 *)(lVar3 + 0x90);
  uVar13 = *(undefined4 *)(lVar3 + 0x94);
  uVar14 = *(undefined4 *)(lVar3 + 0x9c);
  uVar15 = *(undefined4 *)(lVar3 + 0xa0);
  uVar16 = *(undefined4 *)(lVar3 + 0xa4);
  *(undefined4 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&local_c8[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       *(undefined4 *)(lVar3 + 0x98);
  *(undefined4 *)
   ((long)&local_c8[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 0xc) = uVar14;
  *(undefined4 *)
   &local_c8[1].cameras.
    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
    ._M_impl.super__Vector_impl_data._M_start = uVar15;
  *(undefined4 *)
   ((long)&local_c8[1].cameras.
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = uVar16;
  *(undefined4 *)&local_c8[1].super_Entity._vptr_Entity = uVar10;
  *(undefined4 *)((long)&local_c8[1].super_Entity._vptr_Entity + 4) = uVar11;
  *(undefined4 *)
   &local_c8[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar12;
  *(undefined4 *)
   ((long)&local_c8[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4) = uVar13;
  *(undefined4 *)
   &(local_c8->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar6;
  *(undefined4 *)
   ((long)&(local_c8->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
   ) = uVar7;
  *(undefined4 *)
   &(local_c8->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = uVar8;
  *(undefined4 *)
   ((long)&(local_c8->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar9;
  lVar3 = *in_RDX;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"type","");
  bVar17 = syntactic::ParamSet::hasParamString((ParamSet *)(lVar3 + 8),&local_b8);
  paVar2 = &local_e8.field_2;
  if (bVar17) {
    lVar3 = *in_RDX;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"type","");
    syntactic::ParamSet::getParamString((string *)local_70,(ParamSet *)(lVar3 + 8),&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar18 = std::__cxx11::string::compare(local_70);
  if (iVar18 == 0) {
    *(undefined1 *)
     ((long)&local_c8[1].cameras.
             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
             ._M_impl.super__Vector_impl_data + 8) = 0;
  }
  else {
    iVar18 = std::__cxx11::string::compare(local_70);
    if (iVar18 == 0) {
      *(undefined1 *)
       ((long)&local_c8[1].cameras.
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 8) = 2;
    }
    else {
      iVar18 = std::__cxx11::string::compare(local_70);
      if (iVar18 == 0) {
        *(undefined1 *)
         ((long)&local_c8[1].cameras.
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = 1;
      }
      else {
        *(undefined1 *)
         ((long)&local_c8[1].cameras.
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data + 8) = 3;
      }
    }
  }
  lVar3 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"basis","");
  bVar17 = syntactic::ParamSet::hasParamString((ParamSet *)(lVar3 + 8),&local_e8);
  if (bVar17) {
    lVar3 = *in_RDX;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"basis","");
    syntactic::ParamSet::getParamString(&local_b8,(ParamSet *)(lVar3 + 8),&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,(ulong)(local_98.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar18 = std::__cxx11::string::compare((char *)&local_b8);
  if (iVar18 == 0) {
    *(undefined1 *)
     ((long)&local_c8[1].cameras.
             super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
             ._M_impl.super__Vector_impl_data + 9) = 0;
  }
  else {
    iVar18 = std::__cxx11::string::compare((char *)&local_b8);
    if (iVar18 == 0) {
      *(undefined1 *)
       ((long)&local_c8[1].cameras.
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 9) = 1;
    }
    else {
      *(undefined1 *)
       ((long)&local_c8[1].cameras.
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 9) = 2;
    }
  }
  lVar3 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width","");
  bVar17 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar3 + 8),&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar17) {
    lVar3 = *in_RDX;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width","");
    fVar20 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar3 + 8),&local_e8,0.0);
    *(float *)((long)&local_c8[1].sampler.
                      super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
         fVar20;
    *(float *)&local_c8[1].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr = fVar20;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width0","");
  bVar17 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar3 + 8),&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar17) {
    lVar3 = *in_RDX;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width0","");
    fVar20 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar3 + 8),&local_e8,0.0);
    *(float *)&local_c8[1].sampler.super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr = fVar20;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width1","");
  bVar17 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar3 + 8),&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar17) {
    lVar3 = *in_RDX;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"width1","");
    fVar20 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar3 + 8),&local_e8,0.0);
    *(float *)((long)&local_c8[1].sampler.
                      super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
         fVar20;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = *in_RDX;
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"degree","");
  bVar17 = syntactic::ParamSet::hasParam1i((ParamSet *)(lVar3 + 8),&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar17) {
    lVar3 = *in_RDX;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"degree","");
    iVar18 = syntactic::ParamSet::getParam1i((ParamSet *)(lVar3 + 8),&local_e8,0);
    *(char *)((long)&local_c8[1].cameras.
                     super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                     ._M_impl.super__Vector_impl_data + 10) = (char)iVar18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"P","");
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&local_98,
             (SemanticParser *)shape,&local_50,&local_e8);
  psVar4 = *(pointer *)
            ((long)&local_c8[1].cameras.
                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    ._M_impl.super__Vector_impl_data + 0x10);
  p_Var5 = local_c8[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  *(pointer *)
   ((long)&local_c8[1].cameras.
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = local_98._M_dataplus._M_p;
  local_c8[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._M_string_length;
  local_c8[1].film.super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.field_2._M_allocated_capacity;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  _Var19._M_pi = extraout_RDX;
  if (psVar4 != (pointer)0x0) {
    operator_delete(psVar4,(long)p_Var5 - (long)psVar4);
    _Var19._M_pi = extraout_RDX_00;
    if (local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p,
                      local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
      _Var19._M_pi = extraout_RDX_01;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    _Var19._M_pi = extraout_RDX_02;
  }
  if (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var19._M_pi = extraout_RDX_03;
  }
  p_Var5 = p_Stack_c0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  local_c8 = (element_type *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    _Var19._M_pi = extraout_RDX_04;
  }
  if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_70._16_8_ + 1));
    _Var19._M_pi = extraout_RDX_05;
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
    _Var19._M_pi = extraout_RDX_06;
  }
  SVar21.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var19._M_pi;
  SVar21.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar21.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitCurve(pbrt::syntactic::Shape::SP shape)
  {
    Curve::SP ours = std::make_shared<Curve>(findOrCreateMaterial(shape->material));
    ours->transform = shape->transform.atStart;
    // -------------------------------------------------------
    // check 'type'
    // -------------------------------------------------------
    const std::string type
      = shape->hasParamString("type")
      ? shape->getParamString("type")
      : std::string("");
    if (type == "cylinder")
      ours->type = Curve::CurveType_Cylinder;
    else if (type == "ribbon")
      ours->type = Curve::CurveType_Ribbon;
    else if (type == "flat")
      ours->type = Curve::CurveType_Flat;
    else 
      ours->type = Curve::CurveType_Unknown;
        
    // -------------------------------------------------------
    // check 'basis'
    // -------------------------------------------------------
    const std::string basis
      = shape->hasParamString("basis")
      ? shape->getParamString("basis")
      : std::string("");
    if (basis == "bezier")
      ours->basis = Curve::CurveBasis_Bezier;
    else if (basis == "bspline")
      ours->basis = Curve::CurveBasis_BSpline;
    else 
      ours->basis = Curve::CurveBasis_Unknown;
        
    // -------------------------------------------------------
    // check 'width', 'width0', 'width1'
    // -------------------------------------------------------
    if (shape->hasParam1f("width")) 
      ours->width0 = ours->width1 = shape->getParam1f("width");
        
    if (shape->hasParam1f("width0")) 
      ours->width0 = shape->getParam1f("width0");
    if (shape->hasParam1f("width1")) 
      ours->width1 = shape->getParam1f("width1");

    if (shape->hasParam1i("degree")) 
      ours->degree = shape->getParam1i("degree");

    // -------------------------------------------------------
    // vertices - param "P", 3x float each
    // -------------------------------------------------------
    ours->P = extractVector<vec3f>(shape,"P");
    return ours;
  }